

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,ElementSize elementSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  word *pwVar3;
  int iVar4;
  word *pwVar5;
  ulong uVar6;
  AllocateResult AVar7;
  anon_class_1_0_00000001 local_29;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  uVar2 = assertMaxBits<29u,unsigned_int,capnp::_::WireHelpers::initListPointer(capnp::_::WirePointer*,capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,unsigned_int,capnp::ElementSize,capnp::_::BuilderArena*)::_lambda()_1_>
                    (elementCount,&local_29);
  uVar6 = (ulong)uVar2 *
          (ulong)*(uint *)(BITS_PER_ELEMENT_INCLUDING_PONITERS_TABLE + (ulong)(uint)elementSize * 4)
          + 0x3f >> 6;
  if (arena == (BuilderArena *)0x0) {
    iVar4 = ((uint)(_DAT_00000028 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _DAT_00000028;
    AVar7 = (AllocateResult)(auVar1 << 0x40);
    _DAT_00000028 = _DAT_00000028 + (uVar6 & 0xffffffff) * 8;
  }
  else {
    AVar7 = BuilderArena::allocate(arena,(SegmentWordCount)uVar6);
    iVar4 = -3;
  }
  pwVar5 = AVar7.words;
  *(int *)&(__return_storage_ptr__->tag).content = iVar4;
  *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar2 << 3 | (uint)elementSize;
  __return_storage_ptr__->segment = AVar7.segment;
  __return_storage_ptr__->capTable = capTable;
  pwVar3 = pwVar5 + -1;
  if (pwVar5 == (word *)0x0) {
    pwVar3 = pwVar5;
  }
  if (elementSize != INLINE_COMPOSITE) {
    pwVar3 = pwVar5;
  }
  __return_storage_ptr__->location = pwVar3;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, ElementSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}